

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4.c
# Opt level: O0

void * body(MD4_CTX *ctx,void *data,unsigned_long size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  MD4_u32plus saved_d;
  MD4_u32plus saved_c;
  MD4_u32plus saved_b;
  MD4_u32plus saved_a;
  MD4_u32plus d;
  MD4_u32plus c;
  MD4_u32plus b;
  MD4_u32plus a;
  uchar *ptr;
  unsigned_long size_local;
  void *data_local;
  MD4_CTX *ctx_local;
  
  c = ctx->a;
  d = ctx->b;
  saved_a = ctx->c;
  saved_b = ctx->d;
  _b = (int *)data;
  ptr = (uchar *)size;
  do {
    uVar1 = (saved_b ^ d & (saved_a ^ saved_b)) + *_b + c;
    uVar2 = uVar1 * 8 | uVar1 >> 0x1d;
    uVar1 = (saved_a ^ uVar2 & (d ^ saved_a)) + _b[1] + saved_b;
    uVar3 = uVar1 * 0x80 | uVar1 >> 0x19;
    uVar1 = (d ^ uVar3 & (uVar2 ^ d)) + _b[2] + saved_a;
    uVar4 = uVar1 * 0x800 | uVar1 >> 0x15;
    uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + _b[3] + d;
    uVar1 = uVar1 * 0x80000 | uVar1 >> 0xd;
    uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + _b[4] + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + _b[5] + uVar3;
    uVar3 = uVar3 * 0x80 | uVar3 >> 0x19;
    uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + _b[6] + uVar4;
    uVar4 = uVar4 * 0x800 | uVar4 >> 0x15;
    uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + _b[7] + uVar1;
    uVar1 = uVar1 * 0x80000 | uVar1 >> 0xd;
    uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + _b[8] + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + _b[9] + uVar3;
    uVar3 = uVar3 * 0x80 | uVar3 >> 0x19;
    uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + _b[10] + uVar4;
    uVar4 = uVar4 * 0x800 | uVar4 >> 0x15;
    uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + _b[0xb] + uVar1;
    uVar1 = uVar1 * 0x80000 | uVar1 >> 0xd;
    uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + _b[0xc] + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + _b[0xd] + uVar3;
    uVar3 = uVar3 * 0x80 | uVar3 >> 0x19;
    uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + _b[0xe] + uVar4;
    uVar4 = uVar4 * 0x800 | uVar4 >> 0x15;
    uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + _b[0xf] + uVar1;
    uVar1 = uVar1 * 0x80000 | uVar1 >> 0xd;
    uVar2 = (uVar1 & (uVar4 | uVar3) | uVar4 & uVar3) + *_b + 0x5a827999 + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar2 & (uVar1 | uVar4) | uVar1 & uVar4) + _b[4] + 0x5a827999 + uVar3;
    uVar3 = uVar3 * 0x20 | uVar3 >> 0x1b;
    uVar4 = (uVar3 & (uVar2 | uVar1) | uVar2 & uVar1) + _b[8] + 0x5a827999 + uVar4;
    uVar4 = uVar4 * 0x200 | uVar4 >> 0x17;
    uVar1 = (uVar4 & (uVar3 | uVar2) | uVar3 & uVar2) + _b[0xc] + 0x5a827999 + uVar1;
    uVar1 = uVar1 * 0x2000 | uVar1 >> 0x13;
    uVar2 = (uVar1 & (uVar4 | uVar3) | uVar4 & uVar3) + _b[1] + 0x5a827999 + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar2 & (uVar1 | uVar4) | uVar1 & uVar4) + _b[5] + 0x5a827999 + uVar3;
    uVar3 = uVar3 * 0x20 | uVar3 >> 0x1b;
    uVar4 = (uVar3 & (uVar2 | uVar1) | uVar2 & uVar1) + _b[9] + 0x5a827999 + uVar4;
    uVar4 = uVar4 * 0x200 | uVar4 >> 0x17;
    uVar1 = (uVar4 & (uVar3 | uVar2) | uVar3 & uVar2) + _b[0xd] + 0x5a827999 + uVar1;
    uVar1 = uVar1 * 0x2000 | uVar1 >> 0x13;
    uVar2 = (uVar1 & (uVar4 | uVar3) | uVar4 & uVar3) + _b[2] + 0x5a827999 + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar2 & (uVar1 | uVar4) | uVar1 & uVar4) + _b[6] + 0x5a827999 + uVar3;
    uVar3 = uVar3 * 0x20 | uVar3 >> 0x1b;
    uVar4 = (uVar3 & (uVar2 | uVar1) | uVar2 & uVar1) + _b[10] + 0x5a827999 + uVar4;
    uVar4 = uVar4 * 0x200 | uVar4 >> 0x17;
    uVar1 = (uVar4 & (uVar3 | uVar2) | uVar3 & uVar2) + _b[0xe] + 0x5a827999 + uVar1;
    uVar1 = uVar1 * 0x2000 | uVar1 >> 0x13;
    uVar2 = (uVar1 & (uVar4 | uVar3) | uVar4 & uVar3) + _b[3] + 0x5a827999 + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar2 & (uVar1 | uVar4) | uVar1 & uVar4) + _b[7] + 0x5a827999 + uVar3;
    uVar3 = uVar3 * 0x20 | uVar3 >> 0x1b;
    uVar4 = (uVar3 & (uVar2 | uVar1) | uVar2 & uVar1) + _b[0xb] + 0x5a827999 + uVar4;
    uVar4 = uVar4 * 0x200 | uVar4 >> 0x17;
    uVar1 = (uVar4 & (uVar3 | uVar2) | uVar3 & uVar2) + _b[0xf] + 0x5a827999 + uVar1;
    uVar1 = uVar1 * 0x2000 | uVar1 >> 0x13;
    uVar2 = (uVar1 ^ uVar4 ^ uVar3) + *_b + 0x6ed9eba1 + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar2 ^ uVar1 ^ uVar4) + _b[8] + 0x6ed9eba1 + uVar3;
    uVar3 = uVar3 * 0x200 | uVar3 >> 0x17;
    uVar4 = (uVar3 ^ uVar2 ^ uVar1) + _b[4] + 0x6ed9eba1 + uVar4;
    uVar4 = uVar4 * 0x800 | uVar4 >> 0x15;
    uVar1 = (uVar4 ^ uVar3 ^ uVar2) + _b[0xc] + 0x6ed9eba1 + uVar1;
    uVar1 = uVar1 * 0x8000 | uVar1 >> 0x11;
    uVar2 = (uVar1 ^ uVar4 ^ uVar3) + _b[2] + 0x6ed9eba1 + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar2 ^ uVar1 ^ uVar4) + _b[10] + 0x6ed9eba1 + uVar3;
    uVar3 = uVar3 * 0x200 | uVar3 >> 0x17;
    uVar4 = (uVar3 ^ uVar2 ^ uVar1) + _b[6] + 0x6ed9eba1 + uVar4;
    uVar4 = uVar4 * 0x800 | uVar4 >> 0x15;
    uVar1 = (uVar4 ^ uVar3 ^ uVar2) + _b[0xe] + 0x6ed9eba1 + uVar1;
    uVar1 = uVar1 * 0x8000 | uVar1 >> 0x11;
    uVar2 = (uVar1 ^ uVar4 ^ uVar3) + _b[1] + 0x6ed9eba1 + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar2 ^ uVar1 ^ uVar4) + _b[9] + 0x6ed9eba1 + uVar3;
    uVar3 = uVar3 * 0x200 | uVar3 >> 0x17;
    uVar4 = (uVar3 ^ uVar2 ^ uVar1) + _b[5] + 0x6ed9eba1 + uVar4;
    uVar4 = uVar4 * 0x800 | uVar4 >> 0x15;
    uVar1 = (uVar4 ^ uVar3 ^ uVar2) + _b[0xd] + 0x6ed9eba1 + uVar1;
    uVar5 = uVar1 * 0x8000 | uVar1 >> 0x11;
    uVar2 = (uVar5 ^ uVar4 ^ uVar3) + _b[3] + 0x6ed9eba1 + uVar2;
    uVar1 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar1 ^ uVar5 ^ uVar4) + _b[0xb] + 0x6ed9eba1 + uVar3;
    uVar2 = uVar3 * 0x200 | uVar3 >> 0x17;
    uVar4 = (uVar2 ^ uVar1 ^ uVar5) + _b[7] + 0x6ed9eba1 + uVar4;
    uVar3 = uVar4 * 0x800 | uVar4 >> 0x15;
    uVar5 = (uVar3 ^ uVar2 ^ uVar1) + _b[0xf] + 0x6ed9eba1 + uVar5;
    c = c + uVar1;
    d = d + (uVar5 * 0x8000 | uVar5 >> 0x11);
    saved_a = saved_a + uVar3;
    saved_b = saved_b + uVar2;
    _b = _b + 0x10;
    ptr = ptr + -0x40;
  } while (ptr != (uchar *)0x0);
  ctx->a = c;
  ctx->b = d;
  ctx->c = saved_a;
  ctx->d = saved_b;
  return _b;
}

Assistant:

static const void *body(MD4_CTX *ctx, const void *data, unsigned long size)
{
  const unsigned char *ptr;
  MD4_u32plus a, b, c, d;

  ptr = (const unsigned char *)data;

  a = ctx->a;
  b = ctx->b;
  c = ctx->c;
  d = ctx->d;

  do {
    MD4_u32plus saved_a, saved_b, saved_c, saved_d;

    saved_a = a;
    saved_b = b;
    saved_c = c;
    saved_d = d;

/* Round 1 */
    STEP(F, a, b, c, d, SET(0), 3)
    STEP(F, d, a, b, c, SET(1), 7)
    STEP(F, c, d, a, b, SET(2), 11)
    STEP(F, b, c, d, a, SET(3), 19)
    STEP(F, a, b, c, d, SET(4), 3)
    STEP(F, d, a, b, c, SET(5), 7)
    STEP(F, c, d, a, b, SET(6), 11)
    STEP(F, b, c, d, a, SET(7), 19)
    STEP(F, a, b, c, d, SET(8), 3)
    STEP(F, d, a, b, c, SET(9), 7)
    STEP(F, c, d, a, b, SET(10), 11)
    STEP(F, b, c, d, a, SET(11), 19)
    STEP(F, a, b, c, d, SET(12), 3)
    STEP(F, d, a, b, c, SET(13), 7)
    STEP(F, c, d, a, b, SET(14), 11)
    STEP(F, b, c, d, a, SET(15), 19)

/* Round 2 */
    STEP(G, a, b, c, d, GET(0) + 0x5a827999, 3)
    STEP(G, d, a, b, c, GET(4) + 0x5a827999, 5)
    STEP(G, c, d, a, b, GET(8) + 0x5a827999, 9)
    STEP(G, b, c, d, a, GET(12) + 0x5a827999, 13)
    STEP(G, a, b, c, d, GET(1) + 0x5a827999, 3)
    STEP(G, d, a, b, c, GET(5) + 0x5a827999, 5)
    STEP(G, c, d, a, b, GET(9) + 0x5a827999, 9)
    STEP(G, b, c, d, a, GET(13) + 0x5a827999, 13)
    STEP(G, a, b, c, d, GET(2) + 0x5a827999, 3)
    STEP(G, d, a, b, c, GET(6) + 0x5a827999, 5)
    STEP(G, c, d, a, b, GET(10) + 0x5a827999, 9)
    STEP(G, b, c, d, a, GET(14) + 0x5a827999, 13)
    STEP(G, a, b, c, d, GET(3) + 0x5a827999, 3)
    STEP(G, d, a, b, c, GET(7) + 0x5a827999, 5)
    STEP(G, c, d, a, b, GET(11) + 0x5a827999, 9)
    STEP(G, b, c, d, a, GET(15) + 0x5a827999, 13)

/* Round 3 */
    STEP(H, a, b, c, d, GET(0) + 0x6ed9eba1, 3)
    STEP(H, d, a, b, c, GET(8) + 0x6ed9eba1, 9)
    STEP(H, c, d, a, b, GET(4) + 0x6ed9eba1, 11)
    STEP(H, b, c, d, a, GET(12) + 0x6ed9eba1, 15)
    STEP(H, a, b, c, d, GET(2) + 0x6ed9eba1, 3)
    STEP(H, d, a, b, c, GET(10) + 0x6ed9eba1, 9)
    STEP(H, c, d, a, b, GET(6) + 0x6ed9eba1, 11)
    STEP(H, b, c, d, a, GET(14) + 0x6ed9eba1, 15)
    STEP(H, a, b, c, d, GET(1) + 0x6ed9eba1, 3)
    STEP(H, d, a, b, c, GET(9) + 0x6ed9eba1, 9)
    STEP(H, c, d, a, b, GET(5) + 0x6ed9eba1, 11)
    STEP(H, b, c, d, a, GET(13) + 0x6ed9eba1, 15)
    STEP(H, a, b, c, d, GET(3) + 0x6ed9eba1, 3)
    STEP(H, d, a, b, c, GET(11) + 0x6ed9eba1, 9)
    STEP(H, c, d, a, b, GET(7) + 0x6ed9eba1, 11)
    STEP(H, b, c, d, a, GET(15) + 0x6ed9eba1, 15)

    a += saved_a;
    b += saved_b;
    c += saved_c;
    d += saved_d;

    ptr += 64;
  } while(size -= 64);

  ctx->a = a;
  ctx->b = b;
  ctx->c = c;
  ctx->d = d;

  return ptr;
}